

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isPossibleValueRangeElement(TokenKind kind)

{
  bool bVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,kind);
  if (((iVar2 != 0xf) && (iVar2 != 0x18)) && (iVar2 != 0x86)) {
    bVar1 = isPossibleExpression(kind);
    return bVar1;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isPossibleValueRangeElement(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenBracket:
        case TokenKind::Comma:
        case TokenKind::DefaultKeyword:
            return true;
        default:
            return isPossibleExpression(kind);
    }
}